

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_server.c
# Opt level: O1

void msocket_server_destroy(msocket_server_t *self)

{
  pthread_mutex_t *__mutex;
  char *__name;
  void *result;
  void *pvStack_18;
  
  if (self != (msocket_server_t *)0x0) {
    __mutex = &self->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    self->cleanupStop = '\x01';
    if (self->acceptSocket == (msocket_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      msocket_close();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_join(self->acceptThread,&pvStack_18);
    }
    if (self->pDestructor != (_func_void_void_ptr *)0x0) {
      pthread_join(self->cleanupThread,&pvStack_18);
    }
    msocket_ary_destroy(&self->cleanupItems);
    sem_destroy((sem_t *)&self->sem);
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    if (self->udpAddr != (char *)0x0) {
      free(self->udpAddr);
    }
    __name = self->socketPath;
    if (__name != (char *)0x0) {
      if (*__name != '\0') {
        unlink(__name);
      }
      free(self->socketPath);
    }
  }
  return;
}

Assistant:

void msocket_server_destroy(msocket_server_t *self){
#ifndef _WIN32
   void *result;
#endif

   if(self != 0){
      msocket_t *acceptSocket;
      MUTEX_LOCK(self->mutex);
      self->cleanupStop = 1;
      acceptSocket = self->acceptSocket;
      if(acceptSocket != 0){
         msocket_close(acceptSocket);
         MUTEX_UNLOCK(self->mutex);
#ifdef _WIN32
         WaitForSingleObject( self->acceptThread, INFINITE );
         CloseHandle( self->acceptThread );
#else
         pthread_join(self->acceptThread,&result);
#endif
      }
      else {
         MUTEX_UNLOCK(self->mutex);
      }
      if (self->pDestructor != 0) {
#ifdef _WIN32
         WaitForSingleObject( self->cleanupThread, INFINITE );
         CloseHandle( self->cleanupThread );
#else
         pthread_join(self->cleanupThread,&result);
#endif
      }
      msocket_ary_destroy(&self->cleanupItems);
      SEMAPHORE_DESTROY(self->sem);
      MUTEX_DESTROY(self->mutex);
      if(self->udpAddr != 0){
         free(self->udpAddr);
      }
#ifndef _WIN32
      if(self->socketPath != 0){
         if (self->socketPath[0] != '\0') { //files that belong to the abstract namespace (starts with null-byte) does not need to be explicitly deleted
            unlink(self->socketPath);
         }
         free(self->socketPath);
      }
#endif
   }
}